

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

void __thiscall PrintActionsLog::act(PrintActionsLog *this,Restaurant *restaurant)

{
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> *__x;
  ostream *poVar1;
  pointer ppBVar2;
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> res;
  _Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_> local_68;
  string local_50 [32];
  
  __x = Restaurant::getActionsLog(restaurant);
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::vector
            ((vector<BaseAction_*,_std::allocator<BaseAction_*>_> *)&local_68,__x);
  for (ppBVar2 = local_68._M_impl.super__Vector_impl_data._M_start;
      ppBVar2 != local_68._M_impl.super__Vector_impl_data._M_finish; ppBVar2 = ppBVar2 + 1) {
    (*(*ppBVar2)->_vptr_BaseAction[1])(local_50);
    poVar1 = std::operator<<((ostream *)&std::cout,local_50);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_50);
  }
  (this->super_BaseAction).status = COMPLETED;
  std::_Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void PrintActionsLog::act(Restaurant &restaurant)
{
    std::vector<BaseAction*>res = restaurant.getActionsLog();
    for (auto i : res)
    {
        std::cout << i->toString() << "\n" ;
    }
    complete();
}